

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

bool __thiscall
tinyusdz::Attribute::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
          (Attribute *this,vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *v)

{
  char cVar1;
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> ret;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_50;
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> local_38;
  
  if (v == (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)0x0) {
    cVar1 = '\0';
  }
  else {
    primvar::PrimVar::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
              (&local_38,&this->_var);
    cVar1 = local_38.has_value_;
    if (local_38.has_value_ == true) {
      local_50.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_38.contained.data._0_8_;
      local_50.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_38.contained._8_8_;
      local_50.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_38.contained._16_8_;
      local_38.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_38.contained._8_8_ = 0;
      local_38.contained._16_8_ = 0;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_38.contained);
      local_38._0_8_ =
           (v->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_38.contained.data._0_8_ =
           (undefined8)
           (v->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      local_38.contained._8_8_ =
           (v->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (v->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
      super__Vector_impl_data._M_start =
           local_50.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
      (v->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
      super__Vector_impl_data._M_finish =
           local_50.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (v->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_50.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_50.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_50.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_50.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_38);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_50);
    }
  }
  return (bool)cVar1;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }